

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::BitfieldInsertCase::BitfieldInsertCase
          (BitfieldInsertCase *this,TestContext *testCtx,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  char *name;
  VarType local_2b0;
  allocator<char> local_291;
  string local_290;
  Symbol local_270;
  VarType local_238;
  allocator<char> local_219;
  string local_218;
  Symbol local_1f8;
  VarType local_1c0;
  allocator<char> local_1a1;
  string local_1a0;
  Symbol local_180;
  VarType local_148;
  allocator<char> local_129;
  string local_128;
  Symbol local_108;
  VarType local_d0;
  allocator<char> local_b1;
  string local_b0;
  Symbol local_90;
  string local_48;
  ShaderType local_24;
  Precision local_20;
  ShaderType shaderType_local;
  Precision precision_local;
  DataType baseType_local;
  TestContext *testCtx_local;
  BitfieldInsertCase *this_local;
  
  local_24 = shaderType;
  local_20 = precision;
  shaderType_local = baseType;
  _precision_local = testCtx;
  testCtx_local = (TestContext *)this;
  shaderexecutor::(anonymous_namespace)::getIntegerFuncCaseName_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(ulong)baseType,precision,shaderType,shaderType);
  name = (char *)std::__cxx11::string::c_str();
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,testCtx,name,"bitfieldInsert",local_24);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BitfieldInsertCase_016b6a98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"base",&local_b1);
  glu::VarType::VarType(&local_d0,shaderType_local,local_20);
  Symbol::Symbol(&local_90,&local_b0,&local_d0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.inputs,&local_90);
  Symbol::~Symbol(&local_90);
  glu::VarType::~VarType(&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"insert",&local_129);
  glu::VarType::VarType(&local_148,shaderType_local,local_20);
  Symbol::Symbol(&local_108,&local_128,&local_148);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.inputs,&local_108);
  Symbol::~Symbol(&local_108);
  glu::VarType::~VarType(&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"offset",&local_1a1);
  glu::VarType::VarType(&local_1c0,TYPE_INT,local_20);
  Symbol::Symbol(&local_180,&local_1a0,&local_1c0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.inputs,&local_180);
  Symbol::~Symbol(&local_180);
  glu::VarType::~VarType(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"bits",&local_219);
  glu::VarType::VarType(&local_238,TYPE_INT,local_20);
  Symbol::Symbol(&local_1f8,&local_218,&local_238);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.inputs,&local_1f8);
  Symbol::~Symbol(&local_1f8);
  glu::VarType::~VarType(&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"result",&local_291);
  glu::VarType::VarType(&local_2b0,shaderType_local,local_20);
  Symbol::Symbol(&local_270,&local_290,&local_2b0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.outputs,&local_270);
  Symbol::~Symbol(&local_270);
  glu::VarType::~VarType(&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::operator=
            ((string *)&(this->super_IntegerFunctionCase).m_spec.source,
             "result = bitfieldInsert(base, insert, offset, bits);");
  return;
}

Assistant:

BitfieldInsertCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase	(testCtx, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "bitfieldInsert", shaderType)
	{
		m_spec.inputs.push_back(Symbol("base", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("insert", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("offset", glu::VarType(glu::TYPE_INT, precision)));
		m_spec.inputs.push_back(Symbol("bits", glu::VarType(glu::TYPE_INT, precision)));
		m_spec.outputs.push_back(Symbol("result", glu::VarType(baseType, precision)));
		m_spec.source = "result = bitfieldInsert(base, insert, offset, bits);";
	}